

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_manager.c
# Opt level: O2

void plugin_manager_destroy(plugin_manager manager)

{
  _func_void_plugin_manager_void_ptr *p_Var1;
  
  if ((manager->iface != (plugin_manager_interface)0x0) &&
     (p_Var1 = manager->iface->destroy, p_Var1 != (_func_void_plugin_manager_void_ptr *)0x0)) {
    (*p_Var1)(manager,manager->impl);
  }
  if (manager->plugins != (set)0x0) {
    set_iterate(manager->plugins,plugin_manager_destroy_cb,(set_cb_iterate_args)0x0);
  }
  if (manager->name != (char *)0x0) {
    free(manager->name);
    manager->name = (char *)0x0;
  }
  if (manager->plugins != (set)0x0) {
    set_destroy(manager->plugins);
    manager->plugins = (set)0x0;
  }
  if (manager->library_path != (char *)0x0) {
    environment_variable_path_destroy(manager->library_path);
    manager->library_path = (char *)0x0;
  }
  if (manager->l != (plugin_loader_conflict)0x0) {
    plugin_loader_destroy(manager->l);
    manager->l = (plugin_loader)0x0;
  }
  manager->iface = (plugin_manager_interface)0x0;
  manager->impl = (void *)0x0;
  return;
}

Assistant:

void plugin_manager_destroy(plugin_manager manager)
{
	/* If there's a destroy callback, probably the plugin manager needs a complex destroy algorithm */
	if (manager->iface != NULL && manager->iface->destroy != NULL)
	{
		manager->iface->destroy(manager, manager->impl);
	}

	/* Unload and destroy each plugin. The destroy callback is executed before this so the user can clear the
	* plugin set and this will do nothing if the set has been emptied before with plugin_manager_clear */
	if (manager->plugins != NULL)
	{
		set_iterate(manager->plugins, &plugin_manager_destroy_cb, NULL);
	}

	/* Clear the name */
	if (manager->name != NULL)
	{
		free(manager->name);
		manager->name = NULL;
	}

	/* Destroy the plugin set */
	if (manager->plugins != NULL)
	{
		set_destroy(manager->plugins);
		manager->plugins = NULL;
	}

	/* Clear the library path */
	if (manager->library_path != NULL)
	{
		environment_variable_path_destroy(manager->library_path);
		manager->library_path = NULL;
	}

	/* Clear the loader */
	if (manager->l != NULL)
	{
		plugin_loader_destroy(manager->l);
		manager->l = NULL;
	}

	/* Nullify the rest of parameters that do not need deallocation */
	manager->iface = NULL;
	manager->impl = NULL;
}